

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretWord.cpp
# Opt level: O1

bool userWon(string *verify,char (*guesses) [10])

{
  int i;
  long lVar1;
  int iVar2;
  size_type sVar3;
  
  lVar1 = 0;
  iVar2 = 0;
  do {
    if (verify->_M_string_length != 0) {
      sVar3 = 0;
      do {
        iVar2 = iVar2 + (uint)((verify->_M_dataplus)._M_p[sVar3] == (*guesses)[lVar1]);
        sVar3 = sVar3 + 1;
      } while (verify->_M_string_length != sVar3);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return verify->_M_string_length == (long)iVar2;
}

Assistant:

bool userWon(string verify, char (&guesses)[GUESS_NUM])
{
    //function to see if our user has won the game yet
    //returns true or false
    //this checks the number of correct guessed characters verses the number of unique letters

    int correctGuesses = 0;

    for(int i = 0; i < GUESS_NUM; i++)
    {
        for(int j = 0; j < verify.length(); j++)
        {
            if(verify.at(j) == guesses[i])
            {
                correctGuesses++;
            }
        }
    }

    if(correctGuesses == verify.length())
    {
        return true;
    }
    else
    {
        return false;
    }
}